

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDefaultVertexAttributeTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::DefaultVertexAttributeTests::init
          (DefaultVertexAttributeTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  char *name;
  TestNode *pTVar1;
  char *description;
  AttributeCase *pAVar2;
  DefaultVertexAttributeTests *pDVar3;
  byte bVar4;
  bool fullSet;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  TestNode *local_20;
  TestCaseGroup *group;
  DefaultVertexAttributeTests *pDStack_10;
  int targetNdx;
  DefaultVertexAttributeTests *this_local;
  
  group._4_4_ = 0;
  pDVar3 = this;
  pDStack_10 = this;
  while ((int)group._4_4_ < 7) {
    pTVar1 = (TestNode *)operator_new(0x70);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    name = init::floatTargets[(int)group._4_4_].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"test with ",&local_61);
    std::operator+(&local_40,&local_60,init::floatTargets[(int)group._4_4_].name);
    description = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,testCtx,name,description);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    bVar4 = (init::floatTargets[(int)group._4_4_].reducedTestSets ^ 0xffU) & 1;
    local_20 = pTVar1;
    pAVar2 = anon_unknown_1::AttributeCase::
             create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib1f>
                       ((this->super_TestCaseGroup).m_context,
                        init::floatTargets[(int)group._4_4_].dataType);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pAVar2);
    pTVar1 = local_20;
    if (bVar4 != 0) {
      pAVar2 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib2f>
                         ((this->super_TestCaseGroup).m_context,
                          init::floatTargets[(int)group._4_4_].dataType);
      tcu::TestNode::addChild(pTVar1,(TestNode *)pAVar2);
      pTVar1 = local_20;
      pAVar2 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib3f>
                         ((this->super_TestCaseGroup).m_context,
                          init::floatTargets[(int)group._4_4_].dataType);
      tcu::TestNode::addChild(pTVar1,(TestNode *)pAVar2);
    }
    pTVar1 = local_20;
    pAVar2 = anon_unknown_1::AttributeCase::
             create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                       ((this->super_TestCaseGroup).m_context,
                        init::floatTargets[(int)group._4_4_].dataType);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pAVar2);
    pTVar1 = local_20;
    pAVar2 = anon_unknown_1::AttributeCase::
             create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                       ((this->super_TestCaseGroup).m_context,
                        init::floatTargets[(int)group._4_4_].dataType);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pAVar2);
    pTVar1 = local_20;
    if (bVar4 != 0) {
      pAVar2 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib2fv>
                         ((this->super_TestCaseGroup).m_context,
                          init::floatTargets[(int)group._4_4_].dataType);
      tcu::TestNode::addChild(pTVar1,(TestNode *)pAVar2);
      pTVar1 = local_20;
      pAVar2 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib3fv>
                         ((this->super_TestCaseGroup).m_context,
                          init::floatTargets[(int)group._4_4_].dataType);
      tcu::TestNode::addChild(pTVar1,(TestNode *)pAVar2);
    }
    pTVar1 = local_20;
    pAVar2 = anon_unknown_1::AttributeCase::
             create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib4fv>
                       ((this->super_TestCaseGroup).m_context,
                        init::floatTargets[(int)group._4_4_].dataType);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pAVar2);
    tcu::TestNode::addChild((TestNode *)this,local_20);
    group._4_4_ = group._4_4_ + 1;
    pDVar3 = (DefaultVertexAttributeTests *)(ulong)group._4_4_;
  }
  return (int)pDVar3;
}

Assistant:

void DefaultVertexAttributeTests::init (void)
{
	struct Target
	{
		const char*		name;
		glu::DataType	dataType;
		bool			reducedTestSets;	// !< use reduced coverage
	};

	static const Target floatTargets[] =
	{
		{ "float",	glu::TYPE_FLOAT,		false	},
		{ "vec2",	glu::TYPE_FLOAT_VEC2,	true	},
		{ "vec3",	glu::TYPE_FLOAT_VEC3,	true	},
		{ "vec4",	glu::TYPE_FLOAT_VEC4,	false	},
		{ "mat2",	glu::TYPE_FLOAT_MAT2,	true	},
		{ "mat3",	glu::TYPE_FLOAT_MAT3,	true	},
		{ "mat4",	glu::TYPE_FLOAT_MAT4,	false	},
	};

	// float targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(floatTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, floatTargets[targetNdx].name, (std::string("test with ") + floatTargets[targetNdx].name).c_str());
		const bool					fullSet	= !floatTargets[targetNdx].reducedTestSets;

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, floatTargets[targetNdx].dataType))
#define ADD_REDUCED_CASE(X)	if (fullSet) ADD_CASE(X)

		ADD_CASE		(LoaderVertexAttrib1f);
		ADD_REDUCED_CASE(LoaderVertexAttrib2f);
		ADD_REDUCED_CASE(LoaderVertexAttrib3f);
		ADD_CASE		(LoaderVertexAttrib4f);

		ADD_CASE		(LoaderVertexAttrib1fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib2fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib3fv);
		ADD_CASE		(LoaderVertexAttrib4fv);

#undef ADD_CASE
#undef ADD_REDUCED_CASE

		addChild(group);
	}
}